

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

string * __thiscall
tinyusdz::ascii::AsciiParser::GetCurrentPrimPath_abi_cxx11_
          (string *__return_storage_ptr__,AsciiParser *this)

{
  _Elt_pointer pbVar1;
  allocator local_9;
  
  pbVar1 = (this->_path_stack).c.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar1 == (this->_path_stack).c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"/",&local_9);
  }
  else {
    if (pbVar1 == (this->_path_stack).c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar1 = (this->_path_stack).c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(pbVar1 + -1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AsciiParser::GetCurrentPrimPath() {
  if (_path_stack.empty()) {
    return "/";
  }

  return _path_stack.top();
}